

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,Descriptor *message_type,MessageFactory *factory)

{
  int iVar1;
  Extension *pEVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  MessageLite *pMVar4;
  LogMessage local_68;
  LogFinisher local_29;
  
  pEVar2 = FindOrNull(this,number);
  if ((pEVar2 != (Extension *)0x0) && ((pEVar2->field_0xa & 1) == 0)) {
    if (pEVar2->is_repeated == true) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set_heavy.cc"
                 ,0x9d);
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=(&local_29,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pEVar2->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set_heavy.cc"
                 ,0x9d);
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_29,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    pMVar4 = (MessageLite *)(pEVar2->field_0).repeated_string_value;
    if ((pEVar2->field_0xa & 0x10) != 0) {
      iVar1 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
      pMVar4 = (MessageLite *)
               (*(code *)(((RepeatedPtrFieldBase *)&pMVar4->_vptr_MessageLite)->arena_->impl_).
                         initial_block_)(pMVar4,iVar1);
    }
    return pMVar4;
  }
  iVar1 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
  return (MessageLite *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(int number,
                                            const Descriptor* message_type,
                                            MessageFactory* factory) const {
  const Extension* extension = FindOrNull(number);
  if (extension == NULL || extension->is_cleared) {
    // Not present.  Return the default value.
    return *factory->GetPrototype(message_type);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      return extension->lazymessage_value->GetMessage(
          *factory->GetPrototype(message_type));
    } else {
      return *extension->message_value;
    }
  }
}